

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O0

string * __thiscall wire::string::operator=(string *this,char **t)

{
  string local_38;
  char **local_18;
  char **t_local;
  string *this_local;
  
  local_18 = t;
  t_local = (char **)this;
  string(&local_38,t);
  std::__cxx11::string::assign((string *)this);
  ~string(&local_38);
  return this;
}

Assistant:

string &operator=( const T &t )
        {
            this->assign( string(t) );
            return *this;
        }